

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

void jieba_words_free(jieba_words_t *words)

{
  long *in_RDI;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)in_RDI[1]; local_10 = local_10 + 1) {
    if (*(long *)(*in_RDI + local_10 * 8) != 0) {
      free(*(void **)(*in_RDI + local_10 * 8));
    }
  }
  free((void *)*in_RDI);
  free(in_RDI);
  return;
}

Assistant:

void jieba_words_free(jieba_words_t* words) {
    for (size_t i = 0; i < words->length; i++) {
        if (words->words[i] != NULL) {
            free(words->words[i]);
        }
    }
    free(words->words);
    free(words);
}